

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_MultipleMemTables::_Run(_Test_MultipleMemTables *this)

{
  Tester *this_00;
  allocator local_f39;
  Snapshot local_f38 [4];
  undefined1 local_f18 [448];
  char local_d58 [8];
  char buf_1 [100];
  uint local_cec;
  uint64_t uStack_ce8;
  int i_1;
  Tester local_ce0;
  int local_b40 [2];
  Tester local_b38;
  int local_998 [2];
  Tester local_990;
  undefined1 local_7f0 [8];
  Options opt;
  uint64_t old_log_file;
  Tester local_780;
  int local_5e0 [2];
  Tester local_5d8;
  int local_438 [2];
  Tester local_430;
  allocator local_289;
  string local_288 [55];
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [424];
  char local_88 [8];
  char buf [100];
  uint local_18;
  int i;
  int kNum;
  _Test_MultipleMemTables *this_local;
  
  for (local_18 = 0; (int)local_18 < 1000; local_18 = local_18 + 1) {
    snprintf(local_88,100,"%050d",(ulong)local_18);
    test::Tester::Tester
              ((Tester *)(local_230 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0xfa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,local_88,&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,local_88,&local_289);
    RecoveryTest::Put((RecoveryTest *)local_230,(string *)this,(string *)local_250);
    test::Tester::IsOk((Tester *)(local_230 + 8),(Status *)local_230);
    Status::~Status((Status *)local_230);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    test::Tester::~Tester((Tester *)(local_230 + 8));
  }
  test::Tester::Tester
            (&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xfc);
  local_438[1] = 0;
  local_438[0] = RecoveryTest::NumTables(&this->super_RecoveryTest);
  test::Tester::IsEq<int,int>(&local_430,local_438 + 1,local_438);
  test::Tester::~Tester(&local_430);
  RecoveryTest::Close(&this->super_RecoveryTest);
  test::Tester::Tester
            (&local_5d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xfe);
  local_5e0[1] = 0;
  local_5e0[0] = RecoveryTest::NumTables(&this->super_RecoveryTest);
  test::Tester::IsEq<int,int>(&local_5d8,local_5e0 + 1,local_5e0);
  test::Tester::~Tester(&local_5d8);
  test::Tester::Tester
            (&local_780,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xff);
  old_log_file._4_4_ = 1;
  old_log_file._0_4_ = RecoveryTest::NumLogs(&this->super_RecoveryTest);
  test::Tester::IsEq<int,int>(&local_780,(int *)((long)&old_log_file + 4),(int *)&old_log_file);
  test::Tester::~Tester(&local_780);
  opt.filter_policy = (FilterPolicy *)RecoveryTest::FirstLogFile(&this->super_RecoveryTest);
  Options::Options((Options *)local_7f0);
  opt.max_file_size._4_1_ = 1;
  opt.info_log = (Logger *)0xc350;
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)local_7f0);
  test::Tester::Tester
            (&local_990,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x107);
  local_998[1] = 2;
  local_998[0] = RecoveryTest::NumTables(&this->super_RecoveryTest);
  test::Tester::IsLe<int,int>(&local_990,local_998 + 1,local_998);
  test::Tester::~Tester(&local_990);
  test::Tester::Tester
            (&local_b38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x108);
  local_b40[1] = 1;
  local_b40[0] = RecoveryTest::NumLogs(&this->super_RecoveryTest);
  test::Tester::IsEq<int,int>(&local_b38,local_b40 + 1,local_b40);
  test::Tester::~Tester(&local_b38);
  test::Tester::Tester
            (&local_ce0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x109);
  uStack_ce8 = RecoveryTest::FirstLogFile(&this->super_RecoveryTest);
  this_00 = test::Tester::IsNe<unsigned_long,unsigned_long>
                      (&local_ce0,(unsigned_long *)&opt.filter_policy,&stack0xfffffffffffff318);
  test::Tester::operator<<(this_00,(char (*) [19])"must not reuse log");
  test::Tester::~Tester(&local_ce0);
  for (local_cec = 0; (int)local_cec < 1000; local_cec = local_cec + 1) {
    snprintf(local_d58,100,"%050d",(ulong)local_cec);
    test::Tester::Tester
              ((Tester *)(local_f18 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0x10d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f38,local_d58,&local_f39);
    RecoveryTest::Get((RecoveryTest *)local_f18,(string *)this,local_f38);
    test::Tester::IsEq<char[100],std::__cxx11::string>
              ((Tester *)(local_f18 + 0x20),(char (*) [100])local_d58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f18);
    std::__cxx11::string::~string((string *)local_f18);
    std::__cxx11::string::~string((string *)local_f38);
    std::allocator<char>::~allocator((allocator<char> *)&local_f39);
    test::Tester::~Tester((Tester *)(local_f18 + 0x20));
  }
  return;
}

Assistant:

TEST(RecoveryTest, MultipleMemTables) {
  // Make a large log.
  const int kNum = 1000;
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_OK(Put(buf, buf));
  }
  ASSERT_EQ(0, NumTables());
  Close();
  ASSERT_EQ(0, NumTables());
  ASSERT_EQ(1, NumLogs());
  uint64_t old_log_file = FirstLogFile();

  // Force creation of multiple memtables by reducing the write buffer size.
  Options opt;
  opt.reuse_logs = true;
  opt.write_buffer_size = (kNum * 100) / 2;
  Open(&opt);
  ASSERT_LE(2, NumTables());
  ASSERT_EQ(1, NumLogs());
  ASSERT_NE(old_log_file, FirstLogFile()) << "must not reuse log";
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_EQ(buf, Get(buf));
  }
}